

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O2

void __thiscall pbrt::BlackbodySpectrum::BlackbodySpectrum(BlackbodySpectrum *this,Float T)

{
  Float FVar1;
  
  this->T = T;
  FVar1 = Blackbody((0.002897772 / T) * 1e+09,T);
  this->normalizationFactor = 1.0 / FVar1;
  return;
}

Assistant:

PBRT_CPU_GPU
    BlackbodySpectrum(Float T) : T(T) {
        // Compute blackbody normalization constant for given temperature
        Float lambdaMax = 2.8977721e-3f / T;
        normalizationFactor = 1 / Blackbody(lambdaMax * 1e9f, T);
    }